

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis_enc.c
# Opt level: O0

int GetAlpha(VP8Histogram *histo)

{
  int local_18;
  int alpha;
  int last_non_zero;
  int max_value;
  VP8Histogram *histo_local;
  
  if (histo->max_value < 2) {
    local_18 = 0;
  }
  else {
    local_18 = (histo->last_non_zero * 0x1fe) / histo->max_value;
  }
  return local_18;
}

Assistant:

static int GetAlpha(const VP8Histogram* const histo) {
  // 'alpha' will later be clipped to [0..MAX_ALPHA] range, clamping outer
  // values which happen to be mostly noise. This leaves the maximum precision
  // for handling the useful small values which contribute most.
  const int max_value = histo->max_value;
  const int last_non_zero = histo->last_non_zero;
  const int alpha =
      (max_value > 1) ? ALPHA_SCALE * last_non_zero / max_value : 0;
  return alpha;
}